

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_drop_unknown_fields.pb.cc
# Opt level: O0

void unittest_drop_unknown_fields::Foo::MergeImpl(MessageLite *to_msg,MessageLite *from_msg)

{
  uint uVar1;
  int32_t iVar2;
  Foo_NestedEnum FVar3;
  Foo **v1;
  Foo **v2;
  char *failure_msg;
  LogMessage *pLVar4;
  uint32_t *puVar5;
  uint32_t cached_has_bits;
  LogMessage local_50;
  Voidify local_39;
  Foo *local_38;
  Nullable<const_char_*> local_30;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  Foo *from;
  Foo *_this;
  MessageLite *from_msg_local;
  MessageLite *to_msg_local;
  
  local_38 = (Foo *)from_msg;
  absl_log_internal_check_op_result = (Nullable<const_char_*>)from_msg;
  from = (Foo *)to_msg;
  _this = (Foo *)from_msg;
  from_msg_local = to_msg;
  v1 = absl::lts_20250127::log_internal::
       GetReferenceableValue<unittest_drop_unknown_fields::Foo_const*>(&local_38);
  v2 = absl::lts_20250127::log_internal::GetReferenceableValue<unittest_drop_unknown_fields::Foo*>
                 (&from);
  local_30 = absl::lts_20250127::log_internal::
             Check_NEImpl<unittest_drop_unknown_fields::Foo_const*,unittest_drop_unknown_fields::Foo*>
                       (v1,v2,"&from != _this");
  if (local_30 == (Nullable<const_char_*>)0x0) {
    puVar5 = google::protobuf::internal::HasBits<1>::operator[]
                       ((HasBits<1> *)(absl_log_internal_check_op_result + 0x10),0);
    uVar1 = *puVar5;
    if ((uVar1 & 3) != 0) {
      if (((uVar1 & 1) != 0) &&
         (iVar2 = _internal_int32_value((Foo *)absl_log_internal_check_op_result), iVar2 != 0)) {
        (from->field_0)._impl_.int32_value_ = *(int32_t *)(absl_log_internal_check_op_result + 0x18)
        ;
      }
      if (((uVar1 & 2) != 0) &&
         (FVar3 = _internal_enum_value((Foo *)absl_log_internal_check_op_result),
         FVar3 != Foo_NestedEnum_FOO)) {
        (from->field_0)._impl_.enum_value_ = *(int *)(absl_log_internal_check_op_result + 0x1c);
      }
    }
    puVar5 = google::protobuf::internal::HasBits<1>::operator[]
                       (&(from->field_0)._impl_._has_bits_,0);
    *puVar5 = uVar1 | *puVar5;
    google::protobuf::internal::InternalMetadata::MergeFrom<google::protobuf::UnknownFieldSet>
              (&(from->super_Message).super_MessageLite._internal_metadata_,
               (InternalMetadata *)(absl_log_internal_check_op_result + 8));
    return;
  }
  failure_msg = absl::lts_20250127::implicit_cast<char_const*>(local_30);
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_50,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/google/protobuf/unittest_drop_unknown_fields.pb.cc"
             ,0x18e,failure_msg);
  pLVar4 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_50);
  absl::lts_20250127::log_internal::Voidify::operator&&(&local_39,pLVar4);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_50);
}

Assistant:

void Foo::MergeImpl(::google::protobuf::MessageLite& to_msg, const ::google::protobuf::MessageLite& from_msg) {
  auto* const _this = static_cast<Foo*>(&to_msg);
  auto& from = static_cast<const Foo&>(from_msg);
  // @@protoc_insertion_point(class_specific_merge_from_start:unittest_drop_unknown_fields.Foo)
  ABSL_DCHECK_NE(&from, _this);
  ::uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = from._impl_._has_bits_[0];
  if ((cached_has_bits & 0x00000003u) != 0) {
    if ((cached_has_bits & 0x00000001u) != 0) {
      if (from._internal_int32_value() != 0) {
        _this->_impl_.int32_value_ = from._impl_.int32_value_;
      }
    }
    if ((cached_has_bits & 0x00000002u) != 0) {
      if (from._internal_enum_value() != 0) {
        _this->_impl_.enum_value_ = from._impl_.enum_value_;
      }
    }
  }
  _this->_impl_._has_bits_[0] |= cached_has_bits;
  _this->_internal_metadata_.MergeFrom<::google::protobuf::UnknownFieldSet>(from._internal_metadata_);
}